

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O2

int saxTest(char *filename,size_t limit,int options,int fail)

{
  long lVar1;
  long lVar2;
  char *__format;
  int iVar3;
  
  nb_tests = nb_tests + 1;
  maxlen = limit;
  lVar1 = xmlNewSAXParserCtxt(&callbackSAX2HandlerStruct,0);
  if (lVar1 == 0) {
    fwrite("Failed to create parser context\n",0x20,1,_stderr);
    return 1;
  }
  iVar3 = 0;
  lVar2 = xmlCtxtReadFile(lVar1,filename,0,options);
  if (lVar2 == 0) {
    iVar3 = 0;
    if (*(int *)(lVar1 + 0x18) == 0) {
      if (fail != 0) goto LAB_0010319d;
      __format = "Failed to parse \'%s\' %lu\n";
    }
    else {
      if (fail == 0) goto LAB_0010319d;
      __format = "Failed to get failure for \'%s\' %lu\n";
    }
    fprintf(_stderr,__format,filename,limit);
    iVar3 = 1;
  }
  else {
    fwrite("SAX parsing generated a document !\n",0x23,1,_stderr);
    xmlFreeDoc(lVar2);
  }
LAB_0010319d:
  xmlFreeParserCtxt(lVar1);
  return iVar3;
}

Assistant:

static int
saxTest(const char *filename, size_t limit, int options, int fail) {
    int res = 0;
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;

    nb_tests++;

    maxlen = limit;
    ctxt = xmlNewSAXParserCtxt(callbackSAX2Handler, NULL);
    if (ctxt == NULL) {
        fprintf(stderr, "Failed to create parser context\n");
	return(1);
    }
    doc = xmlCtxtReadFile(ctxt, filename, NULL, options);

    if (doc != NULL) {
        fprintf(stderr, "SAX parsing generated a document !\n");
        xmlFreeDoc(doc);
        res = 0;
    } else if (ctxt->wellFormed == 0) {
        if (fail)
            res = 0;
        else {
            fprintf(stderr, "Failed to parse '%s' %lu\n", filename,
                    (unsigned long) limit);
            res = 1;
        }
    } else {
        if (fail) {
            fprintf(stderr, "Failed to get failure for '%s' %lu\n",
                    filename, (unsigned long) limit);
            res = 1;
        } else
            res = 0;
    }
    xmlFreeParserCtxt(ctxt);

    return(res);
}